

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O3

int __thiscall deci::ast_for_t::Generate(ast_for_t *this,ostream *output,int pc)

{
  pointer ppaVar1;
  ast_item_t *paVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  undefined4 in_register_00000014;
  uint uVar6;
  pointer ppaVar7;
  uint uVar8;
  
  iVar4 = (*this->start->_vptr_ast_item_t[2])(this->start,output,CONCAT44(in_register_00000014,pc));
  std::__ostream_insert<char,std::char_traits<char>>(output,"set ",4);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (output,(this->identifier)._M_dataplus._M_p,(this->identifier)._M_string_length
                     );
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  uVar6 = iVar4 + 1;
  std::__ostream_insert<char,std::char_traits<char>>(output,": __for_",8);
  poVar5 = (ostream *)std::ostream::operator<<(output,uVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"__",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  iVar4 = (*this->finish->_vptr_ast_item_t[2])(this->finish,output,(ulong)uVar6);
  std::__ostream_insert<char,std::char_traits<char>>(output,"rval ",5);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (output,(this->identifier)._M_dataplus._M_p,(this->identifier)._M_string_length
                     );
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(output,"bin gr",6);
  cVar3 = (char)output;
  std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(output,"jz __end_for_",0xd);
  poVar5 = (ostream *)std::ostream::operator<<(output,uVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"__",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  uVar8 = iVar4 + 3;
  (this->super_ast_loop_t).end_loc_pos = uVar6;
  ppaVar1 = (this->loop->statements).
            super__Vector_base<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppaVar7 = (this->loop->statements).
                 super__Vector_base<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppaVar7 != ppaVar1; ppaVar7 = ppaVar7 + 1) {
    uVar8 = (*(*ppaVar7)->_vptr_ast_item_t[2])(*ppaVar7,output,(ulong)uVar8);
  }
  paVar2 = this->step;
  if (paVar2 == (ast_item_t *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(output,"push 1",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    iVar4 = uVar8 + 1;
  }
  else {
    iVar4 = (*paVar2->_vptr_ast_item_t[2])(paVar2,output,(ulong)uVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>(output,"rval ",5);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (output,(this->identifier)._M_dataplus._M_p,(this->identifier)._M_string_length
                     );
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(output,"bin sum",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(output,"set ",4);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (output,(this->identifier)._M_dataplus._M_p,(this->identifier)._M_string_length
                     );
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(output,"jmp __for_",10);
  poVar5 = (ostream *)std::ostream::operator<<(output,uVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"__",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(output,": __end_for_",0xc);
  poVar5 = (ostream *)std::ostream::operator<<(output,uVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"__",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return iVar4 + 4;
}

Assistant:

int ast_for_t::Generate(std::ostream& output, int pc) const {
    pc = start->Generate(output, pc);

    output << "set " << this->identifier << std::endl;
    ++pc;

    int check_loc = pc;

    output << ": __for_" << check_loc << "__" << std::endl;

    pc = finish->Generate(output, pc);
    output << "rval " << this->identifier << std::endl;
    output << "bin gr" << std::endl;
    pc += 2;

    output << "jz __end_for_" << check_loc << "__" << std::endl;
    ++pc;

    this->end_loc_pos = check_loc;
    pc = loop->Generate(output, pc);

    if (this->step != nullptr) {
      pc = this->step->Generate(output, pc);
    }
    else {
      output << "push 1" << std::endl;
      ++pc;
    }
    output << "rval " << this->identifier << std::endl;
    output << "bin sum" << std::endl;
    output << "set " << this->identifier << std::endl;
    pc += 3;

    output << "jmp __for_" << check_loc << "__" << std::endl;
    ++pc;

    output << ": __end_for_" << check_loc << "__" << std::endl;

    return pc;
  }